

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O3

char * IoTHubClient_Auth_Get_SasToken
                 (IOTHUB_AUTHORIZATION_HANDLE handle,char *scope,
                 uint64_t expiry_time_relative_seconds,char *key_name)

{
  IOTHUB_CREDENTIAL_TYPE IVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  CREDENTIAL_RESULT *__ptr;
  STRING_HANDLE handle_00;
  uint64_t expiry;
  char *pcVar4;
  char *result;
  uint64_t sec_since_epoch;
  uint64_t sec_since_epoch_1;
  char *local_48;
  ulong local_40;
  DEVICE_AUTH_CREDENTIAL_INFO local_38;
  
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (char *)0x0;
    }
    pcVar4 = "Invalid Parameter handle: %p";
    iVar2 = 0x179;
  }
  else {
    IVar1 = handle->cred_type;
    if (IVar1 == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
      if (scope == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return (char *)0x0;
        }
        pcVar4 = "Invalid Parameter scope: %p";
        iVar2 = 0x1bf;
      }
      else {
        iVar2 = get_seconds_since_epoch((uint64_t *)&local_38);
        if (iVar2 == 0) {
          expiry = 0xffffffffffffffff;
          if (!CARRY8(local_38._0_8_,handle->token_expiry_time_sec)) {
            expiry = local_38._0_8_ + handle->token_expiry_time_sec;
          }
          handle_00 = SASToken_CreateString(handle->device_key,scope,key_name,expiry);
          if (handle_00 != (STRING_HANDLE)0x0) {
            pcVar4 = STRING_c_str(handle_00);
            iVar2 = mallocAndStrcpy_s(&local_48,pcVar4);
            if (iVar2 != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                          ,"IoTHubClient_Auth_Get_SasToken",0x1dd,1,"Failed copying result");
              }
              local_48 = (char *)0x0;
            }
            STRING_delete(handle_00);
            return local_48;
          }
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return (char *)0x0;
          }
          pcVar4 = "Failed creating sas_token";
          iVar2 = 0x1d6;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return (char *)0x0;
          }
          pcVar4 = "failure getting seconds from epoch";
          iVar2 = 0x1c9;
        }
      }
    }
    else if (IVar1 == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) {
      if (handle->device_sas_token == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return (char *)0x0;
        }
        pcVar4 = "failure device sas token is NULL";
        iVar2 = 0x1b7;
      }
      else {
        iVar2 = mallocAndStrcpy_s(&local_48,handle->device_sas_token);
        if (iVar2 == 0) {
          return local_48;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return (char *)0x0;
        }
        pcVar4 = "failure allocating sas token";
        iVar2 = 0x1b1;
      }
    }
    else if (IVar1 == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH) {
      iVar2 = get_seconds_since_epoch(&local_40);
      if (iVar2 == 0) {
        local_38.sas_info.expiry_seconds = 0xffffffffffffffff;
        if (!CARRY8(local_40,handle->token_expiry_time_sec)) {
          local_38.sas_info.expiry_seconds = local_40 + handle->token_expiry_time_sec;
        }
        local_38._0_8_ = 1;
        local_38.sas_info.token_scope = scope;
        local_38.sas_info.key_name = key_name;
        __ptr = iothub_device_auth_generate_credentials(handle->device_auth_handle,&local_38);
        if (__ptr != (CREDENTIAL_RESULT *)0x0) {
          iVar2 = mallocAndStrcpy_s(&local_48,(__ptr->auth_cred_result).x509_result.x509_cert);
          if (iVar2 != 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                        ,"IoTHubClient_Auth_Get_SasToken",0x1a0,1,"failure allocating Sas Token");
            }
            local_48 = (char *)0x0;
          }
          free(__ptr);
          return local_48;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return (char *)0x0;
        }
        pcVar4 = "failure getting credentials from device auth module";
        iVar2 = 0x199;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return (char *)0x0;
        }
        pcVar4 = "failure getting seconds from epoch";
        iVar2 = 0x186;
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return (char *)0x0;
      }
      pcVar4 = "Failed getting sas token invalid credential type";
      iVar2 = 0x1e7;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
            ,"IoTHubClient_Auth_Get_SasToken",iVar2,1,pcVar4);
  return (char *)0x0;
}

Assistant:

char* IoTHubClient_Auth_Get_SasToken(IOTHUB_AUTHORIZATION_HANDLE handle, const char* scope, uint64_t expiry_time_relative_seconds, const char* key_name)
{
    char* result;
    (void)expiry_time_relative_seconds;
    if (handle == NULL)
    {
        LogError("Invalid Parameter handle: %p", handle);
        result = NULL;
    }
    else
    {
        if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)
        {
#ifdef USE_PROV_MODULE
            DEVICE_AUTH_CREDENTIAL_INFO dev_auth_cred;
            uint64_t sec_since_epoch;

            if (get_seconds_since_epoch(&sec_since_epoch) != 0)
            {
                LogError("failure getting seconds from epoch");
                result = NULL;
            }
            else
            {
                memset(&dev_auth_cred, 0, sizeof(DEVICE_AUTH_CREDENTIAL_INFO));
                uint64_t expiry_time = sec_since_epoch + handle->token_expiry_time_sec;
                if (expiry_time < sec_since_epoch)
                {
                    expiry_time = UINT64_MAX;
                }
                dev_auth_cred.sas_info.expiry_seconds = expiry_time;
                dev_auth_cred.sas_info.token_scope = scope;
                dev_auth_cred.sas_info.key_name = key_name;
                dev_auth_cred.dev_auth_type = AUTH_TYPE_SAS;

                CREDENTIAL_RESULT* cred_result = iothub_device_auth_generate_credentials(handle->device_auth_handle, &dev_auth_cred);
                if (cred_result == NULL)
                {
                    LogError("failure getting credentials from device auth module");
                    result = NULL;
                }
                else
                {
                    if (mallocAndStrcpy_s(&result, cred_result->auth_cred_result.sas_result.sas_token) != 0)
                    {
                        LogError("failure allocating Sas Token");
                        result = NULL;
                    }
                    free(cred_result);
                }
            }
#else
            LogError("Failed HSM module is not supported");
            result = NULL;
#endif
        }
        else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
        {
            if (handle->device_sas_token != NULL)
            {
                if (mallocAndStrcpy_s(&result, handle->device_sas_token) != 0)
                {
                    LogError("failure allocating sas token");
                    result = NULL;
                }
            }
            else
            {
                LogError("failure device sas token is NULL");
                result = NULL;
            }
        }
        else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY)
        {
            if (scope == NULL)
            {
                LogError("Invalid Parameter scope: %p", scope);
                result = NULL;
            }
            else
            {
                STRING_HANDLE sas_token;
                uint64_t sec_since_epoch;

                if (get_seconds_since_epoch(&sec_since_epoch) != 0)
                {
                    LogError("failure getting seconds from epoch");
                    result = NULL;
                }
                else
                {
                    uint64_t expiry_time = sec_since_epoch + handle->token_expiry_time_sec;
                    if (expiry_time < sec_since_epoch)
                    {
                        expiry_time = UINT64_MAX;
                    }

                    if ( (sas_token = SASToken_CreateString(handle->device_key, scope, key_name, expiry_time)) == NULL)
                    {
                        LogError("Failed creating sas_token");
                        result = NULL;
                    }
                    else
                    {
                        if (mallocAndStrcpy_s(&result, STRING_c_str(sas_token) ) != 0)
                        {
                            LogError("Failed copying result");
                            result = NULL;
                        }
                        STRING_delete(sas_token);
                    }
                }
            }
        }
        else
        {
            LogError("Failed getting sas token invalid credential type");
            result = NULL;
        }
    }
    return result;
}